

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameplayDisplayer.cpp
# Opt level: O3

void __thiscall GameplayDisplayer::drawWorld(GameplayDisplayer *this,World *world)

{
  PrimitiveDisplayer *pPVar1;
  Tetromino *pTVar2;
  QuadHeap *pQVar3;
  Drawable *pDVar4;
  GLfloat GVar5;
  
  GVar5 = PrimitiveDisplayer::getPixelsPerSquare(this->primitiveDisplayer);
  glPushMatrix();
  glTranslatef(GVar5,GVar5,0);
  pPVar1 = this->primitiveDisplayer;
  pTVar2 = World::getActiveTet(world);
  pDVar4 = &pTVar2->super_Drawable;
  if (pTVar2 == (Tetromino *)0x0) {
    pDVar4 = (Drawable *)0x0;
  }
  PrimitiveDisplayer::drawableWithGLRotation(pPVar1,pDVar4);
  pPVar1 = this->primitiveDisplayer;
  pQVar3 = World::getQuadHeap(world);
  pDVar4 = &pQVar3->super_Drawable;
  if (pQVar3 == (QuadHeap *)0x0) {
    pDVar4 = (Drawable *)0x0;
  }
  PrimitiveDisplayer::drawableWithGLRotation(pPVar1,pDVar4);
  glPopMatrix();
  return;
}

Assistant:

void GameplayDisplayer::drawWorld(World* world) {
    float pps = primitiveDisplayer->getPixelsPerSquare();
    glPushMatrix();
        glTranslatef(pps * 1.f, pps * 1.f, 0.f);
        primitiveDisplayer->drawableWithGLRotation(world->getActiveTet());
        primitiveDisplayer->drawableWithGLRotation(world->getQuadHeap());
    glPopMatrix();
    
}